

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall chrono::ChBody::UpdateForces(ChBody *this,double mytime)

{
  double dVar1;
  double dVar2;
  pointer psVar3;
  ChSystem *pCVar4;
  undefined1 auVar5 [32];
  double dVar6;
  pointer psVar7;
  double dVar8;
  undefined1 auVar9 [32];
  double dVar10;
  double dVar11;
  ChVector<double> mtorque;
  ChVector<double> mforce;
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  dVar10 = (this->Force_acc).m_data[0];
  dVar11 = (this->Force_acc).m_data[1];
  (this->Xforce).m_data[0] = dVar10;
  (this->Xforce).m_data[1] = dVar11;
  dVar8 = (this->Torque_acc).m_data[0];
  dVar1 = (this->Torque_acc).m_data[1];
  dVar2 = (this->Torque_acc).m_data[2];
  (this->Xforce).m_data[2] = (this->Force_acc).m_data[2];
  (this->Xtorque).m_data[0] = dVar8;
  (this->Xtorque).m_data[1] = dVar1;
  (this->Xtorque).m_data[2] = dVar2;
  dVar8 = (this->Force_acc).m_data[2];
  local_48.m_data[2] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  psVar7 = (this->forcelist).
           super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->forcelist).
           super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 != psVar3) {
    do {
      ChForce::Update((psVar7->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr,mytime);
      ChForce::GetBodyForceTorque
                ((psVar7->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 &local_48,&local_68);
      psVar7 = psVar7 + 1;
      dVar10 = local_48.m_data[0] + (this->Xforce).m_data[0];
      dVar11 = local_48.m_data[1] + (this->Xforce).m_data[1];
      (this->Xforce).m_data[0] = dVar10;
      (this->Xforce).m_data[1] = dVar11;
      auVar9._8_8_ = local_68.m_data[2];
      auVar9._0_8_ = local_68.m_data[2];
      auVar9._16_8_ = local_68.m_data[2];
      auVar9._24_8_ = local_68.m_data[2];
      auVar5 = vpermpd_avx2(ZEXT1632(CONCAT88(local_68.m_data[1],local_68.m_data[0])),0xd0);
      auVar5 = vblendpd_avx(auVar5,ZEXT832((ulong)local_48.m_data[2]),1);
      auVar5 = vblendpd_avx(auVar5,auVar9,8);
      dVar1 = (this->Xtorque).m_data[0];
      dVar2 = (this->Xtorque).m_data[1];
      dVar6 = (this->Xtorque).m_data[2];
      dVar8 = auVar5._0_8_ + (this->Xforce).m_data[2];
      (this->Xforce).m_data[2] = dVar8;
      (this->Xtorque).m_data[0] = auVar5._8_8_ + dVar1;
      (this->Xtorque).m_data[1] = auVar5._16_8_ + dVar2;
      (this->Xtorque).m_data[2] = auVar5._24_8_ + dVar6;
    } while (psVar7 != psVar3);
  }
  pCVar4 = (this->super_ChPhysicsItem).system;
  if (pCVar4 != (ChSystem *)0x0) {
    dVar1 = (this->variables).mass;
    dVar2 = (pCVar4->G_acc).m_data[2];
    dVar6 = (pCVar4->G_acc).m_data[1];
    (this->Xforce).m_data[0] = dVar1 * (pCVar4->G_acc).m_data[0] + dVar10;
    (this->Xforce).m_data[1] = dVar1 * dVar6 + dVar11;
    (this->Xforce).m_data[2] = dVar1 * dVar2 + dVar8;
  }
  return;
}

Assistant:

void ChBody::UpdateForces(double mytime) {
    // Initialize body force (in abs. coords) and torque (in local coords)
    // with current values from the accumulators.
    Xforce = Force_acc;
    Xtorque = Torque_acc;

    // Accumulate other applied forces
    ChVector<> mforce;
    ChVector<> mtorque;

    for (auto& force : forcelist) {
        // update positions, f=f(t,q)
        force->Update(mytime);

        force->GetBodyForceTorque(mforce, mtorque);
        Xforce += mforce;
        Xtorque += mtorque;
    }

    // Add gravitational forces
    if (system) {
        Xforce += system->Get_G_acc() * GetMass();
    }
}